

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDirectoryIterator.cpp
# Opt level: O0

void __thiscall de::DirectoryIterator::DirectoryIterator(DirectoryIterator *this,FilePath *path)

{
  deBool dVar1;
  Type TVar2;
  char *__name;
  DIR *pDVar3;
  bool bVar4;
  bool local_35;
  FilePath *path_local;
  DirectoryIterator *this_local;
  
  FilePath::normalize(&this->m_path,path);
  this->m_handle = (DIR *)0x0;
  this->m_curEntry = (dirent *)0x0;
  do {
    dVar1 = ::deGetFalse();
    local_35 = false;
    if (dVar1 == 0) {
      local_35 = FilePath::exists(&this->m_path);
    }
    if (local_35 == false) {
      throwRuntimeError((char *)0x0,"m_path.exists()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deDirectoryIterator.cpp"
                        ,0x55);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    bVar4 = false;
    if (dVar1 == 0) {
      TVar2 = FilePath::getType(&this->m_path);
      bVar4 = TVar2 == TYPE_DIRECTORY;
    }
    if (!bVar4) {
      throwRuntimeError((char *)0x0,"m_path.getType() == FilePath::TYPE_DIRECTORY",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deDirectoryIterator.cpp"
                        ,0x56);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  __name = FilePath::getPath(&this->m_path);
  pDVar3 = opendir(__name);
  this->m_handle = (DIR *)pDVar3;
  do {
    dVar1 = ::deGetFalse();
    bVar4 = false;
    if (dVar1 == 0) {
      bVar4 = this->m_handle != (DIR *)0x0;
    }
    if (!bVar4) {
      throwRuntimeError((char *)0x0,"m_handle",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deDirectoryIterator.cpp"
                        ,0x59);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  next(this);
  return;
}

Assistant:

DirectoryIterator::DirectoryIterator (const FilePath& path)
	: m_path	(FilePath::normalize(path))
	, m_handle	(DE_NULL)
	, m_curEntry(DE_NULL)
{
	DE_CHECK_RUNTIME_ERR(m_path.exists());
	DE_CHECK_RUNTIME_ERR(m_path.getType() == FilePath::TYPE_DIRECTORY);

	m_handle = opendir(m_path.getPath());
	DE_CHECK_RUNTIME_ERR(m_handle);

	// Find first entry
	next();
}